

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O0

bool ParseUInt16(string_view str,uint16_t *out)

{
  string_view str_00;
  bool bVar1;
  size_t in_RSI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  str_00._M_str = pcVar2;
  str_00._M_len = in_RSI;
  bVar1 = anon_unknown.dwarf_f048e7::ParseIntegral<unsigned_short>
                    (str_00,(unsigned_short *)
                            CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar2) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ParseUInt16(std::string_view str, uint16_t* out)
{
    return ParseIntegral<uint16_t>(str, out);
}